

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O2

bool __thiscall cmCTestP4::ChangesParser::ProcessLine(ChangesParser *this)

{
  cmCTestP4 *pcVar1;
  bool bVar2;
  string sStack_38;
  
  bVar2 = cmsys::RegularExpression::find(&this->RegexIdentify,&(this->super_LineParser).Line);
  if (bVar2) {
    pcVar1 = this->P4;
    cmsys::RegularExpression::match_abi_cxx11_(&sStack_38,&this->RegexIdentify,1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &pcVar1->ChangeLists,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return true;
}

Assistant:

bool ProcessLine()
    {
    if(this->RegexIdentify.find(this->Line))
      {
      P4->ChangeLists.push_back(this->RegexIdentify.match(1));
      }
    return true;
    }